

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context_wrapper.cpp
# Opt level: O1

shared_ptr<duckdb::ClientContext,_true> __thiscall
duckdb::ClientContextWrapper::GetContext(ClientContextWrapper *this)

{
  ConnectionException *this_00;
  shared_ptr<duckdb::ClientContext,_true> *actual_context;
  shared_ptr<duckdb::ClientContext,_true> sVar1;
  string local_48;
  
  sVar1 = weak_ptr<duckdb::ClientContext,_true>::lock((weak_ptr<duckdb::ClientContext,_true> *)this)
  ;
  if (this->_vptr_ClientContextWrapper != (_func_int **)0x0) {
    sVar1.internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<duckdb::ClientContext,_true>)
           sVar1.internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (ConnectionException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Connection has already been closed","");
  ConnectionException::ConnectionException(this_00,&local_48);
  __cxa_throw(this_00,&ConnectionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

shared_ptr<ClientContext> ClientContextWrapper::GetContext() {
	auto actual_context = TryGetContext();
	if (!actual_context) {
		throw ConnectionException("Connection has already been closed");
	}
	return actual_context;
}